

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.c
# Opt level: O1

xmlChar * xmlACatalogResolveSystem(xmlCatalogPtr catal,xmlChar *sysID)

{
  xmlChar *pxVar1;
  void *pvVar2;
  
  if (catal != (xmlCatalogPtr)0x0 && sysID != (xmlChar *)0x0) {
    if (xmlDebugCatalogs != 0) {
      xmlCatalogPrintDebug("Resolve sysID %s\n");
    }
    if (catal->type == XML_XML_CATALOG_TYPE) {
      pxVar1 = xmlCatalogListXMLResolve(catal->xml,(xmlChar *)0x0,sysID);
      if (pxVar1 != (xmlChar *)0xffffffffffffffff) {
        return pxVar1;
      }
      return (xmlChar *)0x0;
    }
    if (((catal->sgml == (xmlHashTablePtr)0x0) ||
        (pvVar2 = xmlHashLookup(catal->sgml,sysID), pvVar2 == (void *)0x0)) ||
       (*(int *)((long)pvVar2 + 0x18) != 0xd)) {
      pxVar1 = (xmlChar *)0x0;
    }
    else {
      pxVar1 = *(xmlChar **)((long)pvVar2 + 0x30);
    }
    if (pxVar1 != (xmlChar *)0x0) {
      pxVar1 = xmlStrdup(pxVar1);
      return pxVar1;
    }
  }
  return (xmlChar *)0x0;
}

Assistant:

xmlChar *
xmlACatalogResolveSystem(xmlCatalogPtr catal, const xmlChar *sysID) {
    xmlChar *ret = NULL;

    if ((sysID == NULL) || (catal == NULL))
	return(NULL);

    if (xmlDebugCatalogs)
	xmlCatalogPrintDebug(
		"Resolve sysID %s\n", sysID);

    if (catal->type == XML_XML_CATALOG_TYPE) {
	ret = xmlCatalogListXMLResolve(catal->xml, NULL, sysID);
	if (ret == XML_CATAL_BREAK)
	    ret = NULL;
    } else {
	const xmlChar *sgml;

	sgml = xmlCatalogGetSGMLSystem(catal->sgml, sysID);
	if (sgml != NULL)
	    ret = xmlStrdup(sgml);
    }
    return(ret);
}